

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

int __thiscall
QPlainTextEditControl::hitTest(QPlainTextEditControl *this,QPointF *point,HitTestAccuracy param_3)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  undefined4 uVar5;
  ulong uVar6;
  QPlainTextDocumentLayout *pQVar7;
  qreal *pqVar8;
  int *piVar9;
  undefined8 extraout_RDX;
  QPointF *in_RSI;
  long in_FS_OFFSET;
  qreal qVar10;
  qreal qVar11;
  qreal qVar12;
  QWidgetTextControl *this_00;
  int i;
  QTextLayout *layout;
  QPlainTextDocumentLayout *documentLayout;
  int currentBlockNumber;
  QRectF lr;
  QTextLine line;
  QPointF pos;
  int off;
  QRectF r;
  QPointF offset;
  QTextBlock currentBlock;
  QPointF *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  int local_14c;
  int local_11c;
  int local_118;
  int local_114;
  QRectF local_110;
  undefined1 *local_f0;
  undefined1 *local_e8;
  QPointF local_e0;
  int local_cc;
  qreal local_c8;
  qreal local_c0;
  qreal local_b8;
  qreal local_b0;
  qreal local_a8;
  qreal local_a0;
  qreal local_98;
  qreal local_90;
  QRectF local_88;
  QPointF local_68;
  QTextBlock local_58 [2];
  QTextBlock local_38 [2];
  undefined1 local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_18._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_18._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QWidgetTextControl::document((QWidgetTextControl *)in_stack_fffffffffffffe40);
  QTextDocument::findBlockByNumber((int)local_18);
  uVar6 = QTextBlock::isValid();
  if ((uVar6 & 1) == 0) {
    local_11c = -1;
  }
  else {
    QWidgetTextControl::document((QWidgetTextControl *)in_stack_fffffffffffffe40);
    QTextDocument::documentLayout();
    pQVar7 = qobject_cast<QPlainTextDocumentLayout*>((QObject *)0x6c024f);
    local_68.xp = -NAN;
    local_68.yp = -NAN;
    QPointF::QPointF(&local_68);
    local_88.xp = -NAN;
    local_88.yp = -NAN;
    local_88.w = -NAN;
    local_88.h = -NAN;
    (**(code **)(*(long *)pQVar7 + 0x88))(&local_88,pQVar7,local_18);
    while( true ) {
      QTextBlock::next();
      uVar2 = QTextBlock::isValid();
      bVar1 = false;
      if ((uVar2 & 1) != 0) {
        qVar11 = QRectF::bottom(&local_88);
        qVar12 = QPointF::y(&local_68);
        qVar10 = QPointF::y(in_RSI);
        bVar1 = qVar11 + qVar12 <= qVar10;
      }
      if (!bVar1) break;
      qVar11 = QRectF::height(&local_88);
      pqVar8 = QPointF::ry(&local_68);
      *pqVar8 = qVar11 + *pqVar8;
      QTextBlock::next();
      QTextBlock::operator=((QTextBlock *)local_18,local_38);
      (**(code **)(*(long *)pQVar7 + 0x88))(&local_a8,pQVar7,local_18);
      local_88.xp = local_a8;
      local_88.yp = local_a0;
      local_88.w = local_98;
      local_88.h = local_90;
    }
    while( true ) {
      QTextBlock::previous();
      uVar2 = QTextBlock::isValid();
      bVar1 = false;
      if ((uVar2 & 1) != 0) {
        qVar11 = QRectF::top(&local_88);
        qVar12 = QPointF::y(&local_68);
        qVar10 = QPointF::y(in_RSI);
        bVar1 = qVar10 < qVar11 + qVar12;
      }
      if (!bVar1) break;
      qVar11 = QRectF::height(&local_88);
      pqVar8 = QPointF::ry(&local_68);
      *pqVar8 = *pqVar8 - qVar11;
      QTextBlock::previous();
      QTextBlock::operator=((QTextBlock *)local_18,local_58);
      (**(code **)(*(long *)pQVar7 + 0x88))(&local_c8,pQVar7,local_18);
      local_88.xp = local_c8;
      local_88.yp = local_c0;
      local_88.w = local_b8;
      local_88.h = local_b0;
    }
    uVar6 = QTextBlock::isValid();
    if ((uVar6 & 1) == 0) {
      local_11c = -1;
    }
    else {
      iVar3 = QTextBlock::layout();
      local_cc = 0;
      local_e0.yp = -NAN;
      local_e0.xp = -NAN;
      local_e0 = ::operator-((QPointF *)
                             CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                             in_stack_fffffffffffffe40);
      for (local_14c = 0; iVar4 = QTextLayout::lineCount(), local_14c < iVar4;
          local_14c = local_14c + 1) {
        local_f0 = &DAT_aaaaaaaaaaaaaaaa;
        local_e8 = &DAT_aaaaaaaaaaaaaaaa;
        uVar5 = QTextLayout::lineAt(iVar3);
        local_f0 = (undefined1 *)CONCAT44(local_f0._4_4_,uVar5);
        local_110.xp = -NAN;
        local_110.yp = -NAN;
        local_110.w = -NAN;
        local_110.h = -NAN;
        local_e8 = (undefined1 *)extraout_RDX;
        QTextLine::naturalTextRect();
        qVar11 = QRectF::top(&local_110);
        qVar12 = QPointF::y(&local_e0);
        if (qVar11 <= qVar12) {
          qVar11 = QRectF::bottom(&local_110);
          qVar12 = QPointF::y(&local_e0);
          if (qVar12 < qVar11) {
            this_00 = (QWidgetTextControl *)QPointF::x(&local_e0);
            QWidgetTextControl::overwriteMode(this_00);
            local_cc = QTextLine::xToCursor((double)this_00,(CursorPosition)&local_f0);
            break;
          }
          iVar4 = QTextLine::textStart();
          local_118 = QTextLine::textLength();
          local_118 = iVar4 + local_118;
          piVar9 = qMax<int>(&local_cc,&local_118);
          local_cc = *piVar9;
        }
        else {
          local_114 = QTextLine::textStart();
          piVar9 = qMin<int>(&local_cc,&local_114);
          local_cc = *piVar9;
        }
      }
      local_11c = QTextBlock::position();
      local_11c = local_11c + local_cc;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_11c;
  }
  __stack_chk_fail();
}

Assistant:

int QPlainTextEditControl::hitTest(const QPointF &point, Qt::HitTestAccuracy ) const {
    int currentBlockNumber = topBlock;
    QTextBlock currentBlock = document()->findBlockByNumber(currentBlockNumber);
    if (!currentBlock.isValid())
        return -1;

    QPlainTextDocumentLayout *documentLayout = qobject_cast<QPlainTextDocumentLayout*>(document()->documentLayout());
    Q_ASSERT(documentLayout);

    QPointF offset;
    QRectF r = documentLayout->blockBoundingRect(currentBlock);
    while (currentBlock.next().isValid() && r.bottom() + offset.y() <= point.y()) {
        offset.ry() += r.height();
        currentBlock = currentBlock.next();
        ++currentBlockNumber;
        r = documentLayout->blockBoundingRect(currentBlock);
    }
    while (currentBlock.previous().isValid() && r.top() + offset.y() > point.y()) {
        offset.ry() -= r.height();
        currentBlock = currentBlock.previous();
        --currentBlockNumber;
        r = documentLayout->blockBoundingRect(currentBlock);
    }


    if (!currentBlock.isValid())
        return -1;
    QTextLayout *layout = currentBlock.layout();
    int off = 0;
    QPointF pos = point - offset;
    for (int i = 0; i < layout->lineCount(); ++i) {
        QTextLine line = layout->lineAt(i);
        const QRectF lr = line.naturalTextRect();
        if (lr.top() > pos.y()) {
            off = qMin(off, line.textStart());
        } else if (lr.bottom() <= pos.y()) {
            off = qMax(off, line.textStart() + line.textLength());
        } else {
            off = line.xToCursor(pos.x(), overwriteMode() ?
                                 QTextLine::CursorOnCharacter : QTextLine::CursorBetweenCharacters);
            break;
        }
    }

    return currentBlock.position() + off;
}